

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O1

int64_t __thiscall
disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
WaitFor<long,std::ratio<1l,1000000l>>
          (SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1000000L>_> *timeout)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  function<long_()> min_sequence;
  Sequence *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  timespec local_40;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar8 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  uStack_60 = 0;
  if (bVar8) {
    cursor = (Sequence *)dependents;
  }
  pcStack_50 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
               ::_M_invoke;
  if (!bVar8) {
    pcStack_50 = std::
                 _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
                 ::_M_invoke;
  }
  local_58 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  if (!bVar8) {
    local_58 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  lVar7 = 200;
  local_68 = cursor;
  while( true ) {
    if (local_58 == (code *)0x0) {
      uVar6 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar6);
    }
    lVar4 = (*pcStack_50)(&local_68);
    if (*sequence <= lVar4) goto LAB_00118f91;
    if (((alerted->_M_base)._M_i & 1U) != 0) break;
    if (lVar7 < 0x65) {
      if (lVar7 < 1) {
        local_40.tv_sec = 0;
        local_40.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_40,&local_40);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
      else {
        lVar7 = lVar7 + -1;
        sched_yield();
      }
    }
    else {
      lVar7 = lVar7 + -1;
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    if (lVar1 * 1000 + lVar3 <= lVar4) {
      lVar4 = -3;
LAB_00118f91:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      return lVar4;
    }
  }
  lVar4 = -2;
  goto LAB_00118f91;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }